

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManSetOutputRequireds(Nf_Man_t *p,int fPropCompl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Nf_Mat_t *pNVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  int local_74;
  int NewRequired;
  int nLits;
  int fCompl;
  int iObj;
  int i;
  int fUseConMan;
  int MapDelayOld;
  int Required;
  Gia_Obj_t *pObj;
  int fPropCompl_local;
  Nf_Man_t *p_local;
  
  iVar2 = p->pPars->MapDelay;
  iVar1 = Scl_ConIsRunning();
  bVar5 = false;
  if (iVar1 != 0) {
    iVar1 = Scl_ConHasOutReqs();
    bVar5 = iVar1 != 0;
  }
  iVar1 = Gia_ManObjNum(p->pGia);
  Vec_IntFill(&p->vRequired,iVar1 << 1,0x3fffffff);
  p->pPars->MapDelay = 0;
  fCompl = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pGia->vCos);
    bVar6 = false;
    if (fCompl < iVar1) {
      _MapDelayOld = Gia_ManCo(p->pGia,fCompl);
      bVar6 = _MapDelayOld != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFaninId0p(p->pGia,_MapDelayOld);
    iVar3 = Gia_ObjFaninC0(_MapDelayOld);
    pNVar4 = Nf_ObjMatchD(p,iVar1,iVar3);
    iVar1 = Abc_MaxInt(p->pPars->MapDelay,pNVar4->D);
    p->pPars->MapDelay = iVar1;
    fCompl = fCompl + 1;
  }
  if (((p->Iter != 0) && (iVar2 < p->pPars->MapDelay)) && (p->pGia->vOutReqs == (Vec_Flt_t *)0x0)) {
    fVar7 = Scl_Int2Flt(iVar2);
    Scl_Int2Flt(p->pPars->MapDelay);
    printf("******** Critical delay violation %.2f -> %.2f ********\n",(double)fVar7);
  }
  iVar2 = Abc_MaxInt(p->pPars->MapDelay,iVar2);
  p->pPars->MapDelay = iVar2;
  fVar7 = p->pPars->MapDelayTarget;
  if (((fVar7 == 0.0) && (!NAN(fVar7))) && (p->pPars->nRelaxRatio != 0)) {
    p->pPars->MapDelayTarget = (float)((p->pPars->MapDelay * (p->pPars->nRelaxRatio + 100)) / 100);
  }
  if (0.0 < p->pPars->MapDelayTarget) {
    if (p->pPars->MapDelayTarget <= (float)p->pPars->MapDelay) {
      if (p->pPars->nRelaxRatio == 0) {
        fVar7 = Scl_Int2Flt((int)p->pPars->MapDelayTarget);
        fVar8 = Scl_Int2Flt(p->pPars->MapDelay);
        Abc_Print(0,"Relaxing user-specified delay target from %.2f to %.2f.\n",(double)fVar7,
                  (double)fVar8);
      }
    }
    else {
      p->pPars->MapDelay = (int)p->pPars->MapDelayTarget;
    }
  }
  fCompl = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->pGia->vCos);
    bVar6 = false;
    if (fCompl < iVar2) {
      _MapDelayOld = Gia_ManCo(p->pGia,fCompl);
      bVar6 = _MapDelayOld != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjFaninId0p(p->pGia,_MapDelayOld);
    iVar1 = Gia_ObjFaninC0(_MapDelayOld);
    pNVar4 = Nf_ObjMatchD(p,iVar2,iVar1);
    if (p->pPars->fDoAverage == 0) {
      local_74 = p->pPars->MapDelay;
    }
    else {
      local_74 = (pNVar4->D * (p->pPars->nRelaxRatio + 100)) / 100;
    }
    fUseConMan = local_74;
    if (bVar5) {
      iVar3 = Scl_ConGetOutReq(fCompl);
      if ((0 < iVar3) && (iVar3 = Scl_ConGetOutReq(fCompl), local_74 <= iVar3)) {
        fUseConMan = Scl_ConGetOutReq(fCompl);
      }
    }
    else if (p->pGia->vOutReqs != (Vec_Flt_t *)0x0) {
      fVar7 = Vec_FltEntry(p->pGia->vOutReqs,fCompl);
      iVar3 = Scl_Flt2Int(fVar7);
      if ((0 < iVar3) && (local_74 <= iVar3)) {
        fUseConMan = Abc_MinInt(local_74 << 1,iVar3);
      }
    }
    Nf_ObjUpdateRequired(p,iVar2,iVar1,fUseConMan);
    if (((fPropCompl != 0) && (0 < iVar2)) &&
       (pNVar4 = Nf_ObjMatchBest(p,iVar2,iVar1), (*(uint *)pNVar4 >> 0x1e & 1) != 0)) {
      Nf_ObjUpdateRequired(p,iVar2,(uint)((iVar1 != 0 ^ 0xffU) & 1),fUseConMan - p->InvDelayI);
    }
    fCompl = fCompl + 1;
  }
  return;
}

Assistant:

void Nf_ManSetOutputRequireds( Nf_Man_t * p, int fPropCompl )
{
    Gia_Obj_t * pObj;
    int Required = 0, MapDelayOld = p->pPars->MapDelay;
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    int i, iObj, fCompl, nLits = 2*Gia_ManObjNum(p->pGia);
    Vec_IntFill( &p->vRequired, nLits, SCL_INFINITY );
    // compute delay
    p->pPars->MapDelay = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Required = Nf_ObjMatchD( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj) )->D;
        p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, Required );
    }
    if ( p->Iter && MapDelayOld < p->pPars->MapDelay && p->pGia->vOutReqs == NULL )
        printf( "******** Critical delay violation %.2f -> %.2f ********\n", Scl_Int2Flt(MapDelayOld), Scl_Int2Flt(p->pPars->MapDelay) ); 
    p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, MapDelayOld );
    // check delay target
    if ( p->pPars->MapDelayTarget == 0 && p->pPars->nRelaxRatio )
        p->pPars->MapDelayTarget = p->pPars->MapDelay * (100 + p->pPars->nRelaxRatio) / 100;
    if ( p->pPars->MapDelayTarget > 0 )
    {
        if ( p->pPars->MapDelay < p->pPars->MapDelayTarget )
            p->pPars->MapDelay = p->pPars->MapDelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %.2f to %.2f.\n", Scl_Int2Flt(p->pPars->MapDelayTarget), Scl_Int2Flt(p->pPars->MapDelay) );
    }
    //assert( p->pPars->MapDelayTarget == 0 );
    // set required times
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj     = Gia_ObjFaninId0p(p->pGia, pObj);
        fCompl   = Gia_ObjFaninC0(pObj);
        Required = Nf_ObjMatchD(p, iObj, fCompl)->D;
        Required = p->pPars->fDoAverage ? Required * (100 + p->pPars->nRelaxRatio) / 100 : p->pPars->MapDelay;
        // if external required time can be achieved, use it
        if ( fUseConMan )
        {
            if ( Scl_ConGetOutReq(i) > 0 && Required <= Scl_ConGetOutReq(i) )
                Required = Scl_ConGetOutReq(i);
        }
        else if ( p->pGia->vOutReqs )
        {
            int NewRequired = Scl_Flt2Int(Vec_FltEntry(p->pGia->vOutReqs, i));
            if ( NewRequired > 0 && Required <= NewRequired )
                Required = Abc_MinInt( 2*Required, NewRequired );
        }
        // if external required cannot be achieved, set the earliest possible arrival time
//        else if ( p->pGia->vOutReqs && Vec_FltEntry(p->pGia->vOutReqs, i) > 0 && Required > Vec_FltEntry(p->pGia->vOutReqs, i) )
//            ptTime->Rise = ptTime->Fall = ptTime->Worst = Required;
        // otherwise, set the global required time
        Nf_ObjUpdateRequired( p, iObj, fCompl, Required );
        if ( fPropCompl && iObj > 0 && Nf_ObjMatchBest(p, iObj, fCompl)->fCompl )
            Nf_ObjUpdateRequired( p, iObj, !fCompl, Required - p->InvDelayI );
        //Nf_ObjMapRefInc( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj));
    }
}